

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O0

void Addr_EDI(OPTYPE *pMyOperand,PDISASM pMyDisasm)

{
  size_t sVar1;
  size_t local_20;
  size_t i;
  PDISASM pMyDisasm_local;
  OPTYPE *pMyOperand_local;
  
  local_20 = 0;
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    strcpy(pMyOperand->OpMnemonic,"(%");
    local_20 = 2;
  }
  fillModrm0Register(pMyOperand,pMyDisasm,local_20,'\a');
  if ((pMyDisasm->Reserved_).AddressSize == 0x10) {
    (pMyOperand->Memory).BaseRegister = REGS[3];
  }
  sVar1 = strlen(pMyOperand->OpMnemonic);
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    strcpy(pMyOperand->OpMnemonic + sVar1,")");
  }
  return;
}

Assistant:

void __bea_callspec__ Addr_EDI(OPTYPE* pMyOperand, PDISASM pMyDisasm)
{
    size_t i = 0;
    #ifndef BEA_LIGHT_DISASSEMBLY
    if (GV.SYNTAX_ == ATSyntax) {
        (void) strcpy((char*) pMyOperand->OpMnemonic, "(%");
        i += 2;
    }
    #endif

  fillModrm0Register(pMyOperand, pMyDisasm, i, 7);
  if (GV.AddressSize == 16) {
    pMyOperand->Memory.BaseRegister = REGS[3];
  }
  #ifndef BEA_LIGHT_DISASSEMBLY
  i = strlen ((char*) &pMyOperand->OpMnemonic);
  if (GV.SYNTAX_ == ATSyntax) {
      (void) strcpy((char*) pMyOperand->OpMnemonic+i, ")");
      i += 1;
  }
  #endif
}